

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxmlparser.cpp
# Opt level: O0

void __thiscall
TiXmlDocument::SetError
          (TiXmlDocument *this,int err,char *pError,TiXmlParsingData *data,TiXmlEncoding encoding)

{
  TiXmlCursor *pTVar1;
  TiXmlEncoding encoding_local;
  TiXmlParsingData *data_local;
  char *pError_local;
  int err_local;
  TiXmlDocument *this_local;
  
  if ((this->error & 1U) == 0) {
    if (err < 1 || 0xf < err) {
      __assert_fail("err > 0 && err < TIXML_ERROR_STRING_COUNT",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/luckynote[P]ibug_300W_make_landmarks_tools/src/tinyXML/tinyxmlparser.cpp"
                    ,0x324,
                    "void TiXmlDocument::SetError(int, const char *, TiXmlParsingData *, TiXmlEncoding)"
                   );
    }
    this->error = true;
    this->errorId = err;
    TiXmlString::operator=(&this->errorDesc,TiXmlBase::errorString[this->errorId]);
    TiXmlCursor::Clear(&this->errorLocation);
    if ((pError != (char *)0x0) && (data != (TiXmlParsingData *)0x0)) {
      TiXmlParsingData::Stamp(data,pError,encoding);
      pTVar1 = TiXmlParsingData::Cursor(data);
      this->errorLocation = *pTVar1;
    }
  }
  return;
}

Assistant:

void TiXmlDocument::SetError( int err, const char* pError, TiXmlParsingData* data, TiXmlEncoding encoding )
{	
	// The first error in a chain is more accurate - don't set again!
	if ( error )
		return;

	assert( err > 0 && err < TIXML_ERROR_STRING_COUNT );
	error   = true;
	errorId = err;
	errorDesc = errorString[ errorId ];

	errorLocation.Clear();
	if ( pError && data )
	{
		data->Stamp( pError, encoding );
		errorLocation = data->Cursor();
	}
}